

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O2

int main(void)

{
  Logger *pLVar1;
  double dVar2;
  allocator local_1f2;
  allocator local_1f1;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string((string *)&local_1d0,"./logs",&local_1f1);
  std::__cxx11::string::string((string *)&local_1f0,"logger",&local_1f2);
  pLVar1 = Logger::getInstance(&local_1d0,&local_1f0,LV_TRACE,true);
  Logger::start(pLVar1);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1d0);
  do {
    std::__cxx11::string::string((string *)&local_1b0,"./logs",&local_1f1);
    std::__cxx11::string::string((string *)&local_50,"default",&local_1f2);
    pLVar1 = Logger::getInstance(&local_1b0,&local_50,LV_INFO,true);
    std::__cxx11::string::~string((string *)&local_50);
    dVar2 = (double)std::__cxx11::string::~string((string *)&local_1b0);
    if (pLVar1 != (Logger *)0x0) {
      Logger::log(pLVar1,dVar2);
    }
    std::__cxx11::string::string((string *)&local_70,"./logs",&local_1f1);
    std::__cxx11::string::string((string *)&local_90,"default",&local_1f2);
    pLVar1 = Logger::getInstance(&local_70,&local_90,LV_INFO,true);
    std::__cxx11::string::~string((string *)&local_90);
    dVar2 = (double)std::__cxx11::string::~string((string *)&local_70);
    if (pLVar1 != (Logger *)0x0) {
      Logger::log(pLVar1,dVar2);
    }
    std::__cxx11::string::string((string *)&local_b0,"./logs",&local_1f1);
    std::__cxx11::string::string((string *)&local_d0,"default",&local_1f2);
    pLVar1 = Logger::getInstance(&local_b0,&local_d0,LV_INFO,true);
    std::__cxx11::string::~string((string *)&local_d0);
    dVar2 = (double)std::__cxx11::string::~string((string *)&local_b0);
    if (pLVar1 != (Logger *)0x0) {
      Logger::log(pLVar1,dVar2);
    }
    std::__cxx11::string::string((string *)&local_f0,"./logs",&local_1f1);
    std::__cxx11::string::string((string *)&local_110,"default",&local_1f2);
    pLVar1 = Logger::getInstance(&local_f0,&local_110,LV_INFO,true);
    std::__cxx11::string::~string((string *)&local_110);
    dVar2 = (double)std::__cxx11::string::~string((string *)&local_f0);
    if (pLVar1 != (Logger *)0x0) {
      Logger::log(pLVar1,dVar2);
    }
    std::__cxx11::string::string((string *)&local_130,"./logs",&local_1f1);
    std::__cxx11::string::string((string *)&local_150,"default",&local_1f2);
    pLVar1 = Logger::getInstance(&local_130,&local_150,LV_INFO,true);
    std::__cxx11::string::~string((string *)&local_150);
    dVar2 = (double)std::__cxx11::string::~string((string *)&local_130);
    if (pLVar1 != (Logger *)0x0) {
      Logger::log(pLVar1,dVar2);
    }
    std::__cxx11::string::string((string *)&local_170,"./logs",&local_1f1);
    std::__cxx11::string::string((string *)&local_190,"default",&local_1f2);
    pLVar1 = Logger::getInstance(&local_170,&local_190,LV_INFO,true);
    std::__cxx11::string::~string((string *)&local_190);
    dVar2 = (double)std::__cxx11::string::~string((string *)&local_170);
    if (pLVar1 != (Logger *)0x0) {
      Logger::log(pLVar1,dVar2);
    }
    usleep(1000000);
  } while( true );
}

Assistant:

int main() {
    // 初始化日志模块
    Logger::getInstance("./logs", "logger", LV_TRACE, true)->start();
    while(1) {
        LOG_TRACE("This is a trace log message.");
        LOG_DEBUG("This is a debug log message.");
        LOG_INFO("This is an info log message.");
        LOG_WARN("This is a warning log message.");
        LOG_ERROR("This is an error log message.");
        LOG_FATAL("This is a fatal log message.");
        LOG_SLEEP(1000);
    }
    return 0;
}